

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_flipped_bit(BtorSimBitVector *bv,uint32_t pos)

{
  uint32_t uVar1;
  BtorSimBitVector *bv_00;
  uint32_t in_ESI;
  BtorSimBitVector *res;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  bv_00 = btorsim_bv_copy((BtorSimBitVector *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar1 = btorsim_bv_get_bit(bv_00,in_ESI);
  btorsim_bv_set_bit(bv_00,in_ESI,(uint)(uVar1 == 0));
  set_rem_bits_to_zero(bv_00);
  return bv_00;
}

Assistant:

BtorSimBitVector *
btorsim_bv_flipped_bit (const BtorSimBitVector *bv, uint32_t pos)
{
  assert (bv);
  assert (bv->len > 0);
  assert (pos < bv->width);

  BtorSimBitVector *res;

  res = btorsim_bv_copy (bv);
  btorsim_bv_set_bit (res, pos, btorsim_bv_get_bit (res, pos) ? 0 : 1);
  set_rem_bits_to_zero (res);
  assert (rem_bits_zero_dbg (res));

  return res;
}